

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

VkQueue __thiscall
VulkanUtilities::VulkanLogicalDevice::GetQueue
          (VulkanLogicalDevice *this,HardwareQueueIndex queueFamilyIndex,uint32_t queueIndex)

{
  VkDevice pVVar1;
  PFN_vkGetDeviceQueue p_Var2;
  Uint32 UVar3;
  Char *Message;
  char (*Args_1) [26];
  undefined1 local_48 [8];
  string msg;
  VkQueue vkQueue;
  uint32_t queueIndex_local;
  VulkanLogicalDevice *this_local;
  HardwareQueueIndex queueFamilyIndex_local;
  
  p_Var2 = vkGetDeviceQueue;
  msg.field_2._8_8_ = 0;
  pVVar1 = this->m_VkDevice;
  this_local._7_1_ = queueFamilyIndex.m_Value;
  UVar3 = Diligent::IndexWrapper::operator_cast_to_unsigned_int
                    ((IndexWrapper *)((long)&this_local + 7));
  Args_1 = (char (*) [26])((long)&msg.field_2 + 8);
  (*p_Var2)(pVVar1,UVar3,0,(VkQueue *)Args_1);
  if (msg.field_2._8_8_ == 0) {
    Diligent::FormatString<char[26],char[26]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"vkQueue != VK_NULL_HANDLE",Args_1);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"GetQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x93);
    std::__cxx11::string::~string((string *)local_48);
  }
  return (VkQueue)msg.field_2._8_8_;
}

Assistant:

VkQueue VulkanLogicalDevice::GetQueue(HardwareQueueIndex queueFamilyIndex, uint32_t queueIndex)
{
    VkQueue vkQueue = VK_NULL_HANDLE;
    vkGetDeviceQueue(m_VkDevice,
                     queueFamilyIndex, // Index of the queue family to which the queue belongs
                     0,                // Index within this queue family of the queue to retrieve
                     &vkQueue);
    VERIFY_EXPR(vkQueue != VK_NULL_HANDLE);
    return vkQueue;
}